

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void TraceLog(int logType,char *text,...)

{
  char acStack_b8 [8];
  char buffer [128];
  va_list args;
  char *text_local;
  int logType_local;
  
  if (logTypeLevel <= logType) {
    buffer[0x7c] = '0';
    buffer[0x7d] = '\0';
    buffer[0x7e] = '\0';
    buffer[0x7f] = '\0';
    buffer[0x78] = '\x10';
    buffer[0x79] = '\0';
    buffer[0x7a] = '\0';
    buffer[0x7b] = '\0';
    if (traceLog == (TraceLogCallback)0x0) {
      buffer[0x68] = '\0';
      buffer[0x69] = '\0';
      buffer[0x6a] = '\0';
      buffer[0x6b] = '\0';
      buffer[0x6c] = '\0';
      buffer[0x6d] = '\0';
      buffer[0x6e] = '\0';
      buffer[0x6f] = '\0';
      buffer[0x70] = '\0';
      buffer[0x71] = '\0';
      buffer[0x72] = '\0';
      buffer[0x73] = '\0';
      buffer[0x74] = '\0';
      buffer[0x75] = '\0';
      buffer[0x76] = '\0';
      buffer[0x77] = '\0';
      buffer[0x58] = '\0';
      buffer[0x59] = '\0';
      buffer[0x5a] = '\0';
      buffer[0x5b] = '\0';
      buffer[0x5c] = '\0';
      buffer[0x5d] = '\0';
      buffer[0x5e] = '\0';
      buffer[0x5f] = '\0';
      buffer[0x60] = '\0';
      buffer[0x61] = '\0';
      buffer[0x62] = '\0';
      buffer[99] = '\0';
      buffer[100] = '\0';
      buffer[0x65] = '\0';
      buffer[0x66] = '\0';
      buffer[0x67] = '\0';
      buffer[0x48] = '\0';
      buffer[0x49] = '\0';
      buffer[0x4a] = '\0';
      buffer[0x4b] = '\0';
      buffer[0x4c] = '\0';
      buffer[0x4d] = '\0';
      buffer[0x4e] = '\0';
      buffer[0x4f] = '\0';
      buffer[0x50] = '\0';
      buffer[0x51] = '\0';
      buffer[0x52] = '\0';
      buffer[0x53] = '\0';
      buffer[0x54] = '\0';
      buffer[0x55] = '\0';
      buffer[0x56] = '\0';
      buffer[0x57] = '\0';
      buffer[0x38] = '\0';
      buffer[0x39] = '\0';
      buffer[0x3a] = '\0';
      buffer[0x3b] = '\0';
      buffer[0x3c] = '\0';
      buffer[0x3d] = '\0';
      buffer[0x3e] = '\0';
      buffer[0x3f] = '\0';
      buffer[0x40] = '\0';
      buffer[0x41] = '\0';
      buffer[0x42] = '\0';
      buffer[0x43] = '\0';
      buffer[0x44] = '\0';
      buffer[0x45] = '\0';
      buffer[0x46] = '\0';
      buffer[0x47] = '\0';
      buffer[0x28] = '\0';
      buffer[0x29] = '\0';
      buffer[0x2a] = '\0';
      buffer[0x2b] = '\0';
      buffer[0x2c] = '\0';
      buffer[0x2d] = '\0';
      buffer[0x2e] = '\0';
      buffer[0x2f] = '\0';
      buffer[0x30] = '\0';
      buffer[0x31] = '\0';
      buffer[0x32] = '\0';
      buffer[0x33] = '\0';
      buffer[0x34] = '\0';
      buffer[0x35] = '\0';
      buffer[0x36] = '\0';
      buffer[0x37] = '\0';
      buffer[0x18] = '\0';
      buffer[0x19] = '\0';
      buffer[0x1a] = '\0';
      buffer[0x1b] = '\0';
      buffer[0x1c] = '\0';
      buffer[0x1d] = '\0';
      buffer[0x1e] = '\0';
      buffer[0x1f] = '\0';
      buffer[0x20] = '\0';
      buffer[0x21] = '\0';
      buffer[0x22] = '\0';
      buffer[0x23] = '\0';
      buffer[0x24] = '\0';
      buffer[0x25] = '\0';
      buffer[0x26] = '\0';
      buffer[0x27] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      acStack_b8[0] = '\0';
      acStack_b8[1] = '\0';
      acStack_b8[2] = '\0';
      acStack_b8[3] = '\0';
      acStack_b8[4] = '\0';
      acStack_b8[5] = '\0';
      acStack_b8[6] = '\0';
      acStack_b8[7] = '\0';
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      switch(logType) {
      case 1:
        strcpy(acStack_b8,"TRACE: ");
        break;
      case 2:
        strcpy(acStack_b8,"DEBUG: ");
        break;
      case 3:
        strcpy(acStack_b8,"INFO: ");
        break;
      case 4:
        strcpy(acStack_b8,"WARNING: ");
        break;
      case 5:
        strcpy(acStack_b8,"ERROR: ");
        break;
      case 6:
        strcpy(acStack_b8,"FATAL: ");
      }
      strcat(acStack_b8,text);
      strcat(acStack_b8,"\n");
      vprintf(acStack_b8,buffer + 0x78);
      if (logType == 5) {
        exit(1);
      }
    }
    else {
      (*traceLog)(logType,text,(__va_list_tag *)(buffer + 0x78));
    }
  }
  return;
}

Assistant:

void TraceLog(int logType, const char *text, ...)
{
#if defined(SUPPORT_TRACELOG)
    // Message has level below current threshold, don't emit
    if (logType < logTypeLevel) return;

    va_list args;
    va_start(args, text);

    if (traceLog)
    {
        traceLog(logType, text, args);
        va_end(args);
        return;
    }

#if defined(PLATFORM_ANDROID)
    switch(logType)
    {
        case LOG_TRACE: __android_log_vprint(ANDROID_LOG_VERBOSE, "raylib", text, args); break;
        case LOG_DEBUG: __android_log_vprint(ANDROID_LOG_DEBUG, "raylib", text, args); break;
        case LOG_INFO: __android_log_vprint(ANDROID_LOG_INFO, "raylib", text, args); break;
        case LOG_WARNING: __android_log_vprint(ANDROID_LOG_WARN, "raylib", text, args); break;
        case LOG_ERROR: __android_log_vprint(ANDROID_LOG_ERROR, "raylib", text, args); break;
        case LOG_FATAL: __android_log_vprint(ANDROID_LOG_FATAL, "raylib", text, args); break;
        default: break;
    }
#else
    char buffer[MAX_TRACELOG_MSG_LENGTH] = { 0 };

    switch (logType)
    {
        case LOG_TRACE: strcpy(buffer, "TRACE: "); break;
        case LOG_DEBUG: strcpy(buffer, "DEBUG: "); break;
        case LOG_INFO: strcpy(buffer, "INFO: "); break;
        case LOG_WARNING: strcpy(buffer, "WARNING: "); break;
        case LOG_ERROR: strcpy(buffer, "ERROR: "); break;
        case LOG_FATAL: strcpy(buffer, "FATAL: "); break;
        default: break;
    }

    strcat(buffer, text);
    strcat(buffer, "\n");
    vprintf(buffer, args);
#endif

    va_end(args);

    if (logType == LOG_ERROR) exit(1);  // If error, exit program

#endif  // SUPPORT_TRACELOG
}